

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitUnary(TOutputTraverser *this,TVisit param_1,TIntermUnary *node)

{
  bool bVar1;
  TOperator TVar2;
  TBasicType TVar3;
  TIntermOperator *this_00;
  long *plVar4;
  char *pcVar5;
  TInfoSinkBase *pTVar6;
  TString local_80;
  TString local_58;
  TInfoSink *local_30;
  TInfoSink *out;
  TIntermUnary *node_local;
  TOutputTraverser *pTStack_18;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  local_30 = this->infoSink;
  out = (TInfoSink *)node;
  node_local._4_4_ = param_1;
  pTStack_18 = this;
  OutputTreeText(local_30,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  this_00 = (TIntermOperator *)(**(code **)(*(long *)&(out->info).sink + 0x20))();
  TVar2 = TIntermOperator::getOp(this_00);
  bVar1 = IsOpNumericConv(TVar2);
  if (bVar1) {
    pTVar6 = TInfoSinkBase::operator<<(&local_30->debug,"Convert ");
    plVar4 = (long *)(**(code **)(*(long *)&(out->info).sink + 0x188))();
    plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))();
    TVar3 = (**(code **)(*plVar4 + 0x38))();
    pcVar5 = TType::getBasicString(TVar3);
    pTVar6 = TInfoSinkBase::operator<<(pTVar6,pcVar5);
    pTVar6 = TInfoSinkBase::operator<<(pTVar6," to ");
    plVar4 = (long *)(**(code **)(*(long *)&(out->info).sink + 0xf0))();
    TVar3 = (**(code **)(*plVar4 + 0x38))();
    pcVar5 = TType::getBasicString(TVar3);
    TInfoSinkBase::operator<<(pTVar6,pcVar5);
    pTVar6 = TInfoSinkBase::operator<<(&local_30->debug," (");
    TIntermOperator::getCompleteString_abi_cxx11_(&local_58,(TIntermOperator *)out);
    pTVar6 = TInfoSinkBase::operator<<(pTVar6,&local_58);
    TInfoSinkBase::operator<<(pTVar6,")");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_58);
    TInfoSinkBase::operator<<(&local_30->debug,"\n");
  }
  else {
    TVar2 = TIntermOperator::getOp((TIntermOperator *)out);
    switch(TVar2) {
    case EOpSpirvInst:
      TInfoSinkBase::operator<<(&local_30->debug,"spirv_instruction");
      break;
    case EOpNegative:
      TInfoSinkBase::operator<<(&local_30->debug,"Negate value");
      break;
    case EOpLogicalNot:
    case EOpVectorLogicalNot:
      TInfoSinkBase::operator<<(&local_30->debug,"Negate conditional");
      break;
    case EOpBitwiseNot:
      TInfoSinkBase::operator<<(&local_30->debug,"Bitwise not");
      break;
    case EOpPostIncrement:
      TInfoSinkBase::operator<<(&local_30->debug,"Post-Increment");
      break;
    case EOpPostDecrement:
      TInfoSinkBase::operator<<(&local_30->debug,"Post-Decrement");
      break;
    case EOpPreIncrement:
      TInfoSinkBase::operator<<(&local_30->debug,"Pre-Increment");
      break;
    case EOpPreDecrement:
      TInfoSinkBase::operator<<(&local_30->debug,"Pre-Decrement");
      break;
    case EOpCopyObject:
      TInfoSinkBase::operator<<(&local_30->debug,"copy object");
      break;
    case EOpDeclare:
      TInfoSinkBase::operator<<(&local_30->debug,"Declare");
      break;
    default:
      TInfoSinkBase::message(&local_30->debug,EPrefixError,"Bad unary op");
      break;
    case EOpConvUint64ToPtr:
      TInfoSinkBase::operator<<(&local_30->debug,"Convert uint64_t to pointer");
      break;
    case EOpConvPtrToUint64:
      TInfoSinkBase::operator<<(&local_30->debug,"Convert pointer to uint64_t");
      break;
    case EOpConvUint64ToAccStruct:
      TInfoSinkBase::operator<<(&local_30->debug,"Convert uint64_t to acceleration structure");
      break;
    case EOpConvUvec2ToAccStruct:
      TInfoSinkBase::operator<<(&local_30->debug,"Convert uvec2 to acceleration strucuture ");
      break;
    case EOpRadians:
      TInfoSinkBase::operator<<(&local_30->debug,"radians");
      break;
    case EOpDegrees:
      TInfoSinkBase::operator<<(&local_30->debug,"degrees");
      break;
    case EOpSin:
      TInfoSinkBase::operator<<(&local_30->debug,"sine");
      break;
    case EOpCos:
      TInfoSinkBase::operator<<(&local_30->debug,"cosine");
      break;
    case EOpTan:
      TInfoSinkBase::operator<<(&local_30->debug,"tangent");
      break;
    case EOpAsin:
      TInfoSinkBase::operator<<(&local_30->debug,"arc sine");
      break;
    case EOpAcos:
      TInfoSinkBase::operator<<(&local_30->debug,"arc cosine");
      break;
    case EOpAtan:
      TInfoSinkBase::operator<<(&local_30->debug,"arc tangent");
      break;
    case EOpSinh:
      TInfoSinkBase::operator<<(&local_30->debug,"hyp. sine");
      break;
    case EOpCosh:
      TInfoSinkBase::operator<<(&local_30->debug,"hyp. cosine");
      break;
    case EOpTanh:
      TInfoSinkBase::operator<<(&local_30->debug,"hyp. tangent");
      break;
    case EOpAsinh:
      TInfoSinkBase::operator<<(&local_30->debug,"arc hyp. sine");
      break;
    case EOpAcosh:
      TInfoSinkBase::operator<<(&local_30->debug,"arc hyp. cosine");
      break;
    case EOpAtanh:
      TInfoSinkBase::operator<<(&local_30->debug,"arc hyp. tangent");
      break;
    case EOpExp:
      TInfoSinkBase::operator<<(&local_30->debug,"exp");
      break;
    case EOpLog:
      TInfoSinkBase::operator<<(&local_30->debug,"log");
      break;
    case EOpExp2:
      TInfoSinkBase::operator<<(&local_30->debug,"exp2");
      break;
    case EOpLog2:
      TInfoSinkBase::operator<<(&local_30->debug,"log2");
      break;
    case EOpSqrt:
      TInfoSinkBase::operator<<(&local_30->debug,"sqrt");
      break;
    case EOpInverseSqrt:
      TInfoSinkBase::operator<<(&local_30->debug,"inverse sqrt");
      break;
    case EOpAbs:
      TInfoSinkBase::operator<<(&local_30->debug,"Absolute value");
      break;
    case EOpSign:
      TInfoSinkBase::operator<<(&local_30->debug,"Sign");
      break;
    case EOpFloor:
      TInfoSinkBase::operator<<(&local_30->debug,"Floor");
      break;
    case EOpTrunc:
      TInfoSinkBase::operator<<(&local_30->debug,"trunc");
      break;
    case EOpRound:
      TInfoSinkBase::operator<<(&local_30->debug,"round");
      break;
    case EOpRoundEven:
      TInfoSinkBase::operator<<(&local_30->debug,"roundEven");
      break;
    case EOpCeil:
      TInfoSinkBase::operator<<(&local_30->debug,"Ceiling");
      break;
    case EOpFract:
      TInfoSinkBase::operator<<(&local_30->debug,"Fraction");
      break;
    case EOpIsNan:
      TInfoSinkBase::operator<<(&local_30->debug,"isnan");
      break;
    case EOpIsInf:
      TInfoSinkBase::operator<<(&local_30->debug,"isinf");
      break;
    case EOpFloatBitsToInt:
      TInfoSinkBase::operator<<(&local_30->debug,"floatBitsToInt");
      break;
    case EOpFloatBitsToUint:
      TInfoSinkBase::operator<<(&local_30->debug,"floatBitsToUint");
      break;
    case EOpIntBitsToFloat:
      TInfoSinkBase::operator<<(&local_30->debug,"intBitsToFloat");
      break;
    case EOpUintBitsToFloat:
      TInfoSinkBase::operator<<(&local_30->debug,"uintBitsToFloat");
      break;
    case EOpDoubleBitsToInt64:
      TInfoSinkBase::operator<<(&local_30->debug,"doubleBitsToInt64");
      break;
    case EOpDoubleBitsToUint64:
      TInfoSinkBase::operator<<(&local_30->debug,"doubleBitsToUint64");
      break;
    case EOpInt64BitsToDouble:
      TInfoSinkBase::operator<<(&local_30->debug,"int64BitsToDouble");
      break;
    case EOpUint64BitsToDouble:
      TInfoSinkBase::operator<<(&local_30->debug,"uint64BitsToDouble");
      break;
    case EOpFloat16BitsToInt16:
      TInfoSinkBase::operator<<(&local_30->debug,"float16BitsToInt16");
      break;
    case EOpFloat16BitsToUint16:
      TInfoSinkBase::operator<<(&local_30->debug,"float16BitsToUint16");
      break;
    case EOpInt16BitsToFloat16:
      TInfoSinkBase::operator<<(&local_30->debug,"int16BitsToFloat16");
      break;
    case EOpUint16BitsToFloat16:
      TInfoSinkBase::operator<<(&local_30->debug,"uint16BitsToFloat16");
      break;
    case EOpPackSnorm2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packSnorm2x16");
      break;
    case EOpUnpackSnorm2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackSnorm2x16");
      break;
    case EOpPackUnorm2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packUnorm2x16");
      break;
    case EOpUnpackUnorm2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackUnorm2x16");
      break;
    case EOpPackSnorm4x8:
      TInfoSinkBase::operator<<(&local_30->debug,"PackSnorm4x8");
      break;
    case EOpUnpackSnorm4x8:
      TInfoSinkBase::operator<<(&local_30->debug,"UnpackSnorm4x8");
      break;
    case EOpPackUnorm4x8:
      TInfoSinkBase::operator<<(&local_30->debug,"PackUnorm4x8");
      break;
    case EOpUnpackUnorm4x8:
      TInfoSinkBase::operator<<(&local_30->debug,"UnpackUnorm4x8");
      break;
    case EOpPackHalf2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packHalf2x16");
      break;
    case EOpUnpackHalf2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackHalf2x16");
      break;
    case EOpPackDouble2x32:
      TInfoSinkBase::operator<<(&local_30->debug,"PackDouble2x32");
      break;
    case EOpUnpackDouble2x32:
      TInfoSinkBase::operator<<(&local_30->debug,"UnpackDouble2x32");
      break;
    case EOpPackInt2x32:
      TInfoSinkBase::operator<<(&local_30->debug,"packInt2x32");
      break;
    case EOpUnpackInt2x32:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackInt2x32");
      break;
    case EOpPackUint2x32:
      TInfoSinkBase::operator<<(&local_30->debug,"packUint2x32");
      break;
    case EOpUnpackUint2x32:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackUint2x32");
      break;
    case EOpPackFloat2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packFloat2x16");
      break;
    case EOpUnpackFloat2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackFloat2x16");
      break;
    case EOpPackInt2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packInt2x16");
      break;
    case EOpUnpackInt2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackInt2x16");
      break;
    case EOpPackUint2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packUint2x16");
      break;
    case EOpUnpackUint2x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackUint2x16");
      break;
    case EOpPackInt4x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packInt4x16");
      break;
    case EOpUnpackInt4x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackInt4x16");
      break;
    case EOpPackUint4x16:
      TInfoSinkBase::operator<<(&local_30->debug,"packUint4x16");
      break;
    case EOpUnpackUint4x16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpackUint4x16");
      break;
    case EOpPack16:
      TInfoSinkBase::operator<<(&local_30->debug,"pack16");
      break;
    case EOpPack32:
      TInfoSinkBase::operator<<(&local_30->debug,"pack32");
      break;
    case EOpPack64:
      TInfoSinkBase::operator<<(&local_30->debug,"pack64");
      break;
    case EOpUnpack32:
      TInfoSinkBase::operator<<(&local_30->debug,"unpack32");
      break;
    case EOpUnpack16:
      TInfoSinkBase::operator<<(&local_30->debug,"unpack16");
      break;
    case EOpUnpack8:
      TInfoSinkBase::operator<<(&local_30->debug,"unpack8");
      break;
    case EOpLength:
      TInfoSinkBase::operator<<(&local_30->debug,"length");
      break;
    case EOpNormalize:
      TInfoSinkBase::operator<<(&local_30->debug,"normalize");
      break;
    case EOpDPdx:
      TInfoSinkBase::operator<<(&local_30->debug,"dPdx");
      break;
    case EOpDPdy:
      TInfoSinkBase::operator<<(&local_30->debug,"dPdy");
      break;
    case EOpFwidth:
      TInfoSinkBase::operator<<(&local_30->debug,"fwidth");
      break;
    case EOpDPdxFine:
      TInfoSinkBase::operator<<(&local_30->debug,"dPdxFine");
      break;
    case EOpDPdyFine:
      TInfoSinkBase::operator<<(&local_30->debug,"dPdyFine");
      break;
    case EOpFwidthFine:
      TInfoSinkBase::operator<<(&local_30->debug,"fwidthFine");
      break;
    case EOpDPdxCoarse:
      TInfoSinkBase::operator<<(&local_30->debug,"dPdxCoarse");
      break;
    case EOpDPdyCoarse:
      TInfoSinkBase::operator<<(&local_30->debug,"dPdyCoarse");
      break;
    case EOpFwidthCoarse:
      TInfoSinkBase::operator<<(&local_30->debug,"fwidthCoarse");
      break;
    case EOpInterpolateAtCentroid:
      TInfoSinkBase::operator<<(&local_30->debug,"interpolateAtCentroid");
      break;
    case EOpDeterminant:
      TInfoSinkBase::operator<<(&local_30->debug,"determinant");
      break;
    case EOpMatrixInverse:
      TInfoSinkBase::operator<<(&local_30->debug,"inverse");
      break;
    case EOpTranspose:
      TInfoSinkBase::operator<<(&local_30->debug,"transpose");
      break;
    case EOpNoise:
      TInfoSinkBase::operator<<(&local_30->debug,"noise");
      break;
    case EOpEmitStreamVertex:
      TInfoSinkBase::operator<<(&local_30->debug,"EmitStreamVertex");
      break;
    case EOpEndStreamPrimitive:
      TInfoSinkBase::operator<<(&local_30->debug,"EndStreamPrimitive");
      break;
    case EOpBallot:
      TInfoSinkBase::operator<<(&local_30->debug,"ballot");
      break;
    case EOpReadFirstInvocation:
      TInfoSinkBase::operator<<(&local_30->debug,"readFirstInvocation");
      break;
    case EOpAnyInvocation:
      TInfoSinkBase::operator<<(&local_30->debug,"anyInvocation");
      break;
    case EOpAllInvocations:
      TInfoSinkBase::operator<<(&local_30->debug,"allInvocations");
      break;
    case EOpAllInvocationsEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"allInvocationsEqual");
      break;
    case EOpSubgroupElect:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupElect");
      break;
    case EOpSubgroupAll:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAll");
      break;
    case EOpSubgroupAny:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAny");
      break;
    case EOpSubgroupAllEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAllEqual");
      break;
    case EOpSubgroupBroadcast:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBroadcast");
      break;
    case EOpSubgroupBroadcastFirst:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBroadcastFirst");
      break;
    case EOpSubgroupBallot:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallot");
      break;
    case EOpSubgroupInverseBallot:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInverseBallot");
      break;
    case EOpSubgroupBallotBitExtract:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotBitExtract");
      break;
    case EOpSubgroupBallotBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotBitCount");
      break;
    case EOpSubgroupBallotInclusiveBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotInclusiveBitCount");
      break;
    case EOpSubgroupBallotExclusiveBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotExclusiveBitCount");
      break;
    case EOpSubgroupBallotFindLSB:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotFindLSB");
      break;
    case EOpSubgroupBallotFindMSB:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotFindMSB");
      break;
    case EOpSubgroupShuffle:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffle");
      break;
    case EOpSubgroupShuffleXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffleXor");
      break;
    case EOpSubgroupShuffleUp:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffleUp");
      break;
    case EOpSubgroupShuffleDown:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffleDown");
      break;
    case EOpSubgroupRotate:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupRotate");
      break;
    case EOpSubgroupClusteredRotate:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredRotate");
      break;
    case EOpSubgroupAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAdd");
      break;
    case EOpSubgroupMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMul");
      break;
    case EOpSubgroupMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMin");
      break;
    case EOpSubgroupMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMax");
      break;
    case EOpSubgroupAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAnd");
      break;
    case EOpSubgroupOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupOr");
      break;
    case EOpSubgroupXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupXor");
      break;
    case EOpSubgroupInclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveAdd");
      break;
    case EOpSubgroupInclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveMul");
      break;
    case EOpSubgroupInclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveMin");
      break;
    case EOpSubgroupInclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveMax");
      break;
    case EOpSubgroupInclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveAnd");
      break;
    case EOpSubgroupInclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveOr");
      break;
    case EOpSubgroupInclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveXor");
      break;
    case EOpSubgroupExclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveAdd");
      break;
    case EOpSubgroupExclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveMul");
      break;
    case EOpSubgroupExclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveMin");
      break;
    case EOpSubgroupExclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveMax");
      break;
    case EOpSubgroupExclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveAnd");
      break;
    case EOpSubgroupExclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveOr");
      break;
    case EOpSubgroupExclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveXor");
      break;
    case EOpSubgroupClusteredAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredAdd");
      break;
    case EOpSubgroupClusteredMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredMul");
      break;
    case EOpSubgroupClusteredMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredMin");
      break;
    case EOpSubgroupClusteredMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredMax");
      break;
    case EOpSubgroupClusteredAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredAnd");
      break;
    case EOpSubgroupClusteredOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredOr");
      break;
    case EOpSubgroupClusteredXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredXor");
      break;
    case EOpSubgroupQuadBroadcast:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadBroadcast");
      break;
    case EOpSubgroupQuadSwapHorizontal:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadSwapHorizontal");
      break;
    case EOpSubgroupQuadSwapVertical:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadSwapVertical");
      break;
    case EOpSubgroupQuadSwapDiagonal:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadSwapDiagonal");
      break;
    case EOpSubgroupQuadAll:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadAll");
      break;
    case EOpSubgroupQuadAny:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadAny");
      break;
    case EOpSubgroupPartition:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionNV");
      break;
    case EOpSubgroupPartitionedAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedAddNV");
      break;
    case EOpSubgroupPartitionedMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedMulNV");
      break;
    case EOpSubgroupPartitionedMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedMinNV");
      break;
    case EOpSubgroupPartitionedMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedMaxNV");
      break;
    case EOpSubgroupPartitionedAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedAndNV");
      break;
    case EOpSubgroupPartitionedOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedOrNV");
      break;
    case EOpSubgroupPartitionedXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedXorNV");
      break;
    case EOpSubgroupPartitionedInclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveAddNV");
      break;
    case EOpSubgroupPartitionedInclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveMulNV");
      break;
    case EOpSubgroupPartitionedInclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveMinNV");
      break;
    case EOpSubgroupPartitionedInclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveMaxNV");
      break;
    case EOpSubgroupPartitionedInclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveAndNV");
      break;
    case EOpSubgroupPartitionedInclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveOrNV");
      break;
    case EOpSubgroupPartitionedInclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveXorNV");
      break;
    case EOpSubgroupPartitionedExclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveAddNV");
      break;
    case EOpSubgroupPartitionedExclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveMulNV");
      break;
    case EOpSubgroupPartitionedExclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveMinNV");
      break;
    case EOpSubgroupPartitionedExclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveMaxNV");
      break;
    case EOpSubgroupPartitionedExclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveAndNV");
      break;
    case EOpSubgroupPartitionedExclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveOrNV");
      break;
    case EOpSubgroupPartitionedExclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveXorNV");
      break;
    case EOpMinInvocations:
      TInfoSinkBase::operator<<(&local_30->debug,"minInvocations");
      break;
    case EOpMaxInvocations:
      TInfoSinkBase::operator<<(&local_30->debug,"maxInvocations");
      break;
    case EOpAddInvocations:
      TInfoSinkBase::operator<<(&local_30->debug,"addInvocations");
      break;
    case EOpMinInvocationsNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"minInvocationsNonUniform");
      break;
    case EOpMaxInvocationsNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"maxInvocationsNonUniform");
      break;
    case EOpAddInvocationsNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"addInvocationsNonUniform");
      break;
    case EOpMinInvocationsInclusiveScan:
      TInfoSinkBase::operator<<(&local_30->debug,"minInvocationsInclusiveScan");
      break;
    case EOpMaxInvocationsInclusiveScan:
      TInfoSinkBase::operator<<(&local_30->debug,"maxInvocationsInclusiveScan");
      break;
    case EOpAddInvocationsInclusiveScan:
      TInfoSinkBase::operator<<(&local_30->debug,"addInvocationsInclusiveScan");
      break;
    case EOpMinInvocationsInclusiveScanNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"minInvocationsInclusiveScanNonUniform");
      break;
    case EOpMaxInvocationsInclusiveScanNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"maxInvocationsInclusiveScanNonUniform");
      break;
    case EOpAddInvocationsInclusiveScanNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"addInvocationsInclusiveScanNonUniform");
      break;
    case EOpMinInvocationsExclusiveScan:
      TInfoSinkBase::operator<<(&local_30->debug,"minInvocationsExclusiveScan");
      break;
    case EOpMaxInvocationsExclusiveScan:
      TInfoSinkBase::operator<<(&local_30->debug,"maxInvocationsExclusiveScan");
      break;
    case EOpAddInvocationsExclusiveScan:
      TInfoSinkBase::operator<<(&local_30->debug,"addInvocationsExclusiveScan");
      break;
    case EOpMinInvocationsExclusiveScanNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"minInvocationsExclusiveScanNonUniform");
      break;
    case EOpMaxInvocationsExclusiveScanNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"maxInvocationsExclusiveScanNonUniform");
      break;
    case EOpAddInvocationsExclusiveScanNonUniform:
      TInfoSinkBase::operator<<(&local_30->debug,"addInvocationsExclusiveScanNonUniform");
      break;
    case EOpMbcnt:
      TInfoSinkBase::operator<<(&local_30->debug,"mbcnt");
      break;
    case EOpCubeFaceIndex:
      TInfoSinkBase::operator<<(&local_30->debug,"cubeFaceIndex");
      break;
    case EOpCubeFaceCoord:
      TInfoSinkBase::operator<<(&local_30->debug,"cubeFaceCoord");
      break;
    case EOpAtomicCounterIncrement:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterIncrement");
      break;
    case EOpAtomicCounterDecrement:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterDecrement");
      break;
    case EOpAtomicCounter:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounter");
      break;
    case EOpAny:
      TInfoSinkBase::operator<<(&local_30->debug,"any");
      break;
    case EOpAll:
      TInfoSinkBase::operator<<(&local_30->debug,"all");
      break;
    case EOpCreateTensorLayoutNV:
      TInfoSinkBase::operator<<(&local_30->debug,"createTensorLayoutNV");
      break;
    case EOpTensorLayoutSetBlockSizeNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorLayoutBlockSizeNV");
      break;
    case EOpTensorLayoutSetDimensionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorLayoutDimensionNV");
      break;
    case EOpTensorLayoutSetStrideNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorLayoutStrideNV");
      break;
    case EOpTensorLayoutSliceNV:
      TInfoSinkBase::operator<<(&local_30->debug,"sliceTensorLayoutNV");
      break;
    case EOpTensorLayoutSetClampValueNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorLayoutClampValueNV");
      break;
    case EOpCreateTensorViewNV:
      TInfoSinkBase::operator<<(&local_30->debug,"createTensorViewNV");
      break;
    case EOpTensorViewSetDimensionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorViewDimensionsNV");
      break;
    case EOpTensorViewSetStrideNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorViewStrideNV");
      break;
    case EOpTensorViewSetClipNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorViewClipNV");
      break;
    case EOpConstructReference:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct reference type");
      break;
    case EOpArrayLength:
      TInfoSinkBase::operator<<(&local_30->debug,"array length");
      break;
    case EOpImageQuerySize:
      TInfoSinkBase::operator<<(&local_30->debug,"imageQuerySize");
      break;
    case EOpImageQuerySamples:
      TInfoSinkBase::operator<<(&local_30->debug,"imageQuerySamples");
      break;
    case EOpImageLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"imageLoad");
      break;
    case EOpSubpassLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"subpassLoad");
      break;
    case EOpSubpassLoadMS:
      TInfoSinkBase::operator<<(&local_30->debug,"subpassLoadMS");
      break;
    case EOpColorAttachmentReadEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"colorAttachmentReadEXT");
      break;
    case EOpTextureQuerySize:
      TInfoSinkBase::operator<<(&local_30->debug,"textureSize");
      break;
    case EOpTextureQueryLod:
      TInfoSinkBase::operator<<(&local_30->debug,"textureQueryLod");
      break;
    case EOpTextureQueryLevels:
      TInfoSinkBase::operator<<(&local_30->debug,"textureQueryLevels");
      break;
    case EOpTextureQuerySamples:
      TInfoSinkBase::operator<<(&local_30->debug,"textureSamples");
      break;
    case EOpFragmentMaskFetch:
      TInfoSinkBase::operator<<(&local_30->debug,"fragmentMaskFetchAMD");
      break;
    case EOpFragmentFetch:
      TInfoSinkBase::operator<<(&local_30->debug,"fragmentFetchAMD");
      break;
    case EOpSparseTexelsResident:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTexelsResident");
      break;
    case EOpBitFieldReverse:
      TInfoSinkBase::operator<<(&local_30->debug,"bitFieldReverse");
      break;
    case EOpBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"bitCount");
      break;
    case EOpFindLSB:
      TInfoSinkBase::operator<<(&local_30->debug,"findLSB");
      break;
    case EOpFindMSB:
      TInfoSinkBase::operator<<(&local_30->debug,"findMSB");
      break;
    case EOpCountLeadingZeros:
      TInfoSinkBase::operator<<(&local_30->debug,"countLeadingZeros");
      break;
    case EOpCountTrailingZeros:
      TInfoSinkBase::operator<<(&local_30->debug,"countTrailingZeros");
      break;
    case EOpClip:
      TInfoSinkBase::operator<<(&local_30->debug,"clip");
      break;
    case EOpIsFinite:
      TInfoSinkBase::operator<<(&local_30->debug,"isfinite");
      break;
    case EOpLog10:
      TInfoSinkBase::operator<<(&local_30->debug,"log10");
      break;
    case EOpRcp:
      TInfoSinkBase::operator<<(&local_30->debug,"rcp");
      break;
    case EOpSaturate:
      TInfoSinkBase::operator<<(&local_30->debug,"saturate");
    }
    pTVar6 = TInfoSinkBase::operator<<(&local_30->debug," (");
    TIntermOperator::getCompleteString_abi_cxx11_(&local_80,(TIntermOperator *)out);
    pTVar6 = TInfoSinkBase::operator<<(pTVar6,&local_80);
    TInfoSinkBase::operator<<(pTVar6,")");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_80);
    TInfoSinkBase::operator<<(&local_30->debug,"\n");
  }
  return true;
}

Assistant:

bool TOutputTraverser::visitUnary(TVisit /* visit */, TIntermUnary* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    if (IsOpNumericConv(node->getAsOperator()->getOp())) {
        out.debug << "Convert " << TType::getBasicString(node->getOperand()->getType().getBasicType()) << " to " << TType::getBasicString(node->getType().getBasicType());
        out.debug << " (" << node->getCompleteString() << ")";
        out.debug << "\n";
        return true;
    }

    switch (node->getOp()) {
    case EOpNegative:       out.debug << "Negate value";         break;
    case EOpVectorLogicalNot:
    case EOpLogicalNot:     out.debug << "Negate conditional";   break;
    case EOpBitwiseNot:     out.debug << "Bitwise not";          break;

    case EOpPostIncrement:  out.debug << "Post-Increment";       break;
    case EOpPostDecrement:  out.debug << "Post-Decrement";       break;
    case EOpPreIncrement:   out.debug << "Pre-Increment";        break;
    case EOpPreDecrement:   out.debug << "Pre-Decrement";        break;
    case EOpCopyObject:     out.debug << "copy object";          break;

    case EOpConvUint64ToPtr:  out.debug << "Convert uint64_t to pointer";   break;
    case EOpConvPtrToUint64:  out.debug << "Convert pointer to uint64_t";   break;

    case EOpConvUint64ToAccStruct: out.debug << "Convert uint64_t to acceleration structure"; break;
    case EOpConvUvec2ToAccStruct:  out.debug << "Convert uvec2 to acceleration strucuture "; break;

    case EOpRadians:        out.debug << "radians";              break;
    case EOpDegrees:        out.debug << "degrees";              break;
    case EOpSin:            out.debug << "sine";                 break;
    case EOpCos:            out.debug << "cosine";               break;
    case EOpTan:            out.debug << "tangent";              break;
    case EOpAsin:           out.debug << "arc sine";             break;
    case EOpAcos:           out.debug << "arc cosine";           break;
    case EOpAtan:           out.debug << "arc tangent";          break;
    case EOpSinh:           out.debug << "hyp. sine";            break;
    case EOpCosh:           out.debug << "hyp. cosine";          break;
    case EOpTanh:           out.debug << "hyp. tangent";         break;
    case EOpAsinh:          out.debug << "arc hyp. sine";        break;
    case EOpAcosh:          out.debug << "arc hyp. cosine";      break;
    case EOpAtanh:          out.debug << "arc hyp. tangent";     break;

    case EOpExp:            out.debug << "exp";                  break;
    case EOpLog:            out.debug << "log";                  break;
    case EOpExp2:           out.debug << "exp2";                 break;
    case EOpLog2:           out.debug << "log2";                 break;
    case EOpSqrt:           out.debug << "sqrt";                 break;
    case EOpInverseSqrt:    out.debug << "inverse sqrt";         break;

    case EOpAbs:            out.debug << "Absolute value";       break;
    case EOpSign:           out.debug << "Sign";                 break;
    case EOpFloor:          out.debug << "Floor";                break;
    case EOpTrunc:          out.debug << "trunc";                break;
    case EOpRound:          out.debug << "round";                break;
    case EOpRoundEven:      out.debug << "roundEven";            break;
    case EOpCeil:           out.debug << "Ceiling";              break;
    case EOpFract:          out.debug << "Fraction";             break;

    case EOpIsNan:          out.debug << "isnan";                break;
    case EOpIsInf:          out.debug << "isinf";                break;

    case EOpFloatBitsToInt: out.debug << "floatBitsToInt";       break;
    case EOpFloatBitsToUint:out.debug << "floatBitsToUint";      break;
    case EOpIntBitsToFloat: out.debug << "intBitsToFloat";       break;
    case EOpUintBitsToFloat:out.debug << "uintBitsToFloat";      break;
    case EOpDoubleBitsToInt64:  out.debug << "doubleBitsToInt64";  break;
    case EOpDoubleBitsToUint64: out.debug << "doubleBitsToUint64"; break;
    case EOpInt64BitsToDouble:  out.debug << "int64BitsToDouble";  break;
    case EOpUint64BitsToDouble: out.debug << "uint64BitsToDouble"; break;
    case EOpFloat16BitsToInt16:  out.debug << "float16BitsToInt16";  break;
    case EOpFloat16BitsToUint16: out.debug << "float16BitsToUint16"; break;
    case EOpInt16BitsToFloat16:  out.debug << "int16BitsToFloat16";  break;
    case EOpUint16BitsToFloat16: out.debug << "uint16BitsToFloat16"; break;

    case EOpPackSnorm2x16:  out.debug << "packSnorm2x16";        break;
    case EOpUnpackSnorm2x16:out.debug << "unpackSnorm2x16";      break;
    case EOpPackUnorm2x16:  out.debug << "packUnorm2x16";        break;
    case EOpUnpackUnorm2x16:out.debug << "unpackUnorm2x16";      break;
    case EOpPackHalf2x16:   out.debug << "packHalf2x16";         break;
    case EOpUnpackHalf2x16: out.debug << "unpackHalf2x16";       break;
    case EOpPack16:           out.debug << "pack16";                 break;
    case EOpPack32:           out.debug << "pack32";                 break;
    case EOpPack64:           out.debug << "pack64";                 break;
    case EOpUnpack32:         out.debug << "unpack32";               break;
    case EOpUnpack16:         out.debug << "unpack16";               break;
    case EOpUnpack8:          out.debug << "unpack8";               break;

    case EOpPackSnorm4x8:     out.debug << "PackSnorm4x8";       break;
    case EOpUnpackSnorm4x8:   out.debug << "UnpackSnorm4x8";     break;
    case EOpPackUnorm4x8:     out.debug << "PackUnorm4x8";       break;
    case EOpUnpackUnorm4x8:   out.debug << "UnpackUnorm4x8";     break;
    case EOpPackDouble2x32:   out.debug << "PackDouble2x32";     break;
    case EOpUnpackDouble2x32: out.debug << "UnpackDouble2x32";   break;

    case EOpPackInt2x32:      out.debug << "packInt2x32";        break;
    case EOpUnpackInt2x32:    out.debug << "unpackInt2x32";      break;
    case EOpPackUint2x32:     out.debug << "packUint2x32";       break;
    case EOpUnpackUint2x32:   out.debug << "unpackUint2x32";     break;

    case EOpPackInt2x16:      out.debug << "packInt2x16";        break;
    case EOpUnpackInt2x16:    out.debug << "unpackInt2x16";      break;
    case EOpPackUint2x16:     out.debug << "packUint2x16";       break;
    case EOpUnpackUint2x16:   out.debug << "unpackUint2x16";     break;

    case EOpPackInt4x16:      out.debug << "packInt4x16";        break;
    case EOpUnpackInt4x16:    out.debug << "unpackInt4x16";      break;
    case EOpPackUint4x16:     out.debug << "packUint4x16";       break;
    case EOpUnpackUint4x16:   out.debug << "unpackUint4x16";     break;
    case EOpPackFloat2x16:    out.debug << "packFloat2x16";      break;
    case EOpUnpackFloat2x16:  out.debug << "unpackFloat2x16";    break;

    case EOpLength:         out.debug << "length";               break;
    case EOpNormalize:      out.debug << "normalize";            break;
    case EOpDPdx:           out.debug << "dPdx";                 break;
    case EOpDPdy:           out.debug << "dPdy";                 break;
    case EOpFwidth:         out.debug << "fwidth";               break;
    case EOpDPdxFine:       out.debug << "dPdxFine";             break;
    case EOpDPdyFine:       out.debug << "dPdyFine";             break;
    case EOpFwidthFine:     out.debug << "fwidthFine";           break;
    case EOpDPdxCoarse:     out.debug << "dPdxCoarse";           break;
    case EOpDPdyCoarse:     out.debug << "dPdyCoarse";           break;
    case EOpFwidthCoarse:   out.debug << "fwidthCoarse";         break;

    case EOpInterpolateAtCentroid: out.debug << "interpolateAtCentroid";  break;

    case EOpDeterminant:    out.debug << "determinant";          break;
    case EOpMatrixInverse:  out.debug << "inverse";              break;
    case EOpTranspose:      out.debug << "transpose";            break;

    case EOpAny:            out.debug << "any";                  break;
    case EOpAll:            out.debug << "all";                  break;

    case EOpArrayLength:    out.debug << "array length";         break;

    case EOpEmitStreamVertex:   out.debug << "EmitStreamVertex";   break;
    case EOpEndStreamPrimitive: out.debug << "EndStreamPrimitive"; break;

    case EOpAtomicCounterIncrement: out.debug << "AtomicCounterIncrement";break;
    case EOpAtomicCounterDecrement: out.debug << "AtomicCounterDecrement";break;
    case EOpAtomicCounter:          out.debug << "AtomicCounter";         break;

    case EOpTextureQuerySize:       out.debug << "textureSize";           break;
    case EOpTextureQueryLod:        out.debug << "textureQueryLod";       break;
    case EOpTextureQueryLevels:     out.debug << "textureQueryLevels";    break;
    case EOpTextureQuerySamples:    out.debug << "textureSamples";        break;
    case EOpImageQuerySize:         out.debug << "imageQuerySize";        break;
    case EOpImageQuerySamples:      out.debug << "imageQuerySamples";     break;
    case EOpImageLoad:              out.debug << "imageLoad";             break;

    case EOpBitFieldReverse:        out.debug << "bitFieldReverse";       break;
    case EOpBitCount:               out.debug << "bitCount";              break;
    case EOpFindLSB:                out.debug << "findLSB";               break;
    case EOpFindMSB:                out.debug << "findMSB";               break;

    case EOpCountLeadingZeros:      out.debug << "countLeadingZeros";     break;
    case EOpCountTrailingZeros:     out.debug << "countTrailingZeros";    break;

    case EOpNoise:                  out.debug << "noise";                 break;

    case EOpBallot:                 out.debug << "ballot";                break;
    case EOpReadFirstInvocation:    out.debug << "readFirstInvocation";   break;

    case EOpAnyInvocation:          out.debug << "anyInvocation";         break;
    case EOpAllInvocations:         out.debug << "allInvocations";        break;
    case EOpAllInvocationsEqual:    out.debug << "allInvocationsEqual";   break;

    case EOpSubgroupElect:                   out.debug << "subgroupElect";                   break;
    case EOpSubgroupAll:                     out.debug << "subgroupAll";                     break;
    case EOpSubgroupAny:                     out.debug << "subgroupAny";                     break;
    case EOpSubgroupAllEqual:                out.debug << "subgroupAllEqual";                break;
    case EOpSubgroupBroadcast:               out.debug << "subgroupBroadcast";               break;
    case EOpSubgroupBroadcastFirst:          out.debug << "subgroupBroadcastFirst";          break;
    case EOpSubgroupBallot:                  out.debug << "subgroupBallot";                  break;
    case EOpSubgroupInverseBallot:           out.debug << "subgroupInverseBallot";           break;
    case EOpSubgroupBallotBitExtract:        out.debug << "subgroupBallotBitExtract";        break;
    case EOpSubgroupBallotBitCount:          out.debug << "subgroupBallotBitCount";          break;
    case EOpSubgroupBallotInclusiveBitCount: out.debug << "subgroupBallotInclusiveBitCount"; break;
    case EOpSubgroupBallotExclusiveBitCount: out.debug << "subgroupBallotExclusiveBitCount"; break;
    case EOpSubgroupBallotFindLSB:           out.debug << "subgroupBallotFindLSB";           break;
    case EOpSubgroupBallotFindMSB:           out.debug << "subgroupBallotFindMSB";           break;
    case EOpSubgroupShuffle:                 out.debug << "subgroupShuffle";                 break;
    case EOpSubgroupShuffleXor:              out.debug << "subgroupShuffleXor";              break;
    case EOpSubgroupShuffleUp:               out.debug << "subgroupShuffleUp";               break;
    case EOpSubgroupShuffleDown:             out.debug << "subgroupShuffleDown";             break;
    case EOpSubgroupRotate:                  out.debug << "subgroupRotate";                  break;
    case EOpSubgroupClusteredRotate:         out.debug << "subgroupClusteredRotate";         break;
    case EOpSubgroupAdd:                     out.debug << "subgroupAdd";                     break;
    case EOpSubgroupMul:                     out.debug << "subgroupMul";                     break;
    case EOpSubgroupMin:                     out.debug << "subgroupMin";                     break;
    case EOpSubgroupMax:                     out.debug << "subgroupMax";                     break;
    case EOpSubgroupAnd:                     out.debug << "subgroupAnd";                     break;
    case EOpSubgroupOr:                      out.debug << "subgroupOr";                      break;
    case EOpSubgroupXor:                     out.debug << "subgroupXor";                     break;
    case EOpSubgroupInclusiveAdd:            out.debug << "subgroupInclusiveAdd";            break;
    case EOpSubgroupInclusiveMul:            out.debug << "subgroupInclusiveMul";            break;
    case EOpSubgroupInclusiveMin:            out.debug << "subgroupInclusiveMin";            break;
    case EOpSubgroupInclusiveMax:            out.debug << "subgroupInclusiveMax";            break;
    case EOpSubgroupInclusiveAnd:            out.debug << "subgroupInclusiveAnd";            break;
    case EOpSubgroupInclusiveOr:             out.debug << "subgroupInclusiveOr";             break;
    case EOpSubgroupInclusiveXor:            out.debug << "subgroupInclusiveXor";            break;
    case EOpSubgroupExclusiveAdd:            out.debug << "subgroupExclusiveAdd";            break;
    case EOpSubgroupExclusiveMul:            out.debug << "subgroupExclusiveMul";            break;
    case EOpSubgroupExclusiveMin:            out.debug << "subgroupExclusiveMin";            break;
    case EOpSubgroupExclusiveMax:            out.debug << "subgroupExclusiveMax";            break;
    case EOpSubgroupExclusiveAnd:            out.debug << "subgroupExclusiveAnd";            break;
    case EOpSubgroupExclusiveOr:             out.debug << "subgroupExclusiveOr";             break;
    case EOpSubgroupExclusiveXor:            out.debug << "subgroupExclusiveXor";            break;
    case EOpSubgroupClusteredAdd:            out.debug << "subgroupClusteredAdd";            break;
    case EOpSubgroupClusteredMul:            out.debug << "subgroupClusteredMul";            break;
    case EOpSubgroupClusteredMin:            out.debug << "subgroupClusteredMin";            break;
    case EOpSubgroupClusteredMax:            out.debug << "subgroupClusteredMax";            break;
    case EOpSubgroupClusteredAnd:            out.debug << "subgroupClusteredAnd";            break;
    case EOpSubgroupClusteredOr:             out.debug << "subgroupClusteredOr";             break;
    case EOpSubgroupClusteredXor:            out.debug << "subgroupClusteredXor";            break;
    case EOpSubgroupQuadBroadcast:           out.debug << "subgroupQuadBroadcast";           break;
    case EOpSubgroupQuadSwapHorizontal:      out.debug << "subgroupQuadSwapHorizontal";      break;
    case EOpSubgroupQuadSwapVertical:        out.debug << "subgroupQuadSwapVertical";        break;
    case EOpSubgroupQuadSwapDiagonal:        out.debug << "subgroupQuadSwapDiagonal";        break;
    case EOpSubgroupQuadAll:                 out.debug << "subgroupQuadAll";                 break;
    case EOpSubgroupQuadAny:                 out.debug << "subgroupQuadAny";                 break;

    case EOpSubgroupPartition:                          out.debug << "subgroupPartitionNV";                          break;
    case EOpSubgroupPartitionedAdd:                     out.debug << "subgroupPartitionedAddNV";                     break;
    case EOpSubgroupPartitionedMul:                     out.debug << "subgroupPartitionedMulNV";                     break;
    case EOpSubgroupPartitionedMin:                     out.debug << "subgroupPartitionedMinNV";                     break;
    case EOpSubgroupPartitionedMax:                     out.debug << "subgroupPartitionedMaxNV";                     break;
    case EOpSubgroupPartitionedAnd:                     out.debug << "subgroupPartitionedAndNV";                     break;
    case EOpSubgroupPartitionedOr:                      out.debug << "subgroupPartitionedOrNV";                      break;
    case EOpSubgroupPartitionedXor:                     out.debug << "subgroupPartitionedXorNV";                     break;
    case EOpSubgroupPartitionedInclusiveAdd:            out.debug << "subgroupPartitionedInclusiveAddNV";            break;
    case EOpSubgroupPartitionedInclusiveMul:            out.debug << "subgroupPartitionedInclusiveMulNV";            break;
    case EOpSubgroupPartitionedInclusiveMin:            out.debug << "subgroupPartitionedInclusiveMinNV";            break;
    case EOpSubgroupPartitionedInclusiveMax:            out.debug << "subgroupPartitionedInclusiveMaxNV";            break;
    case EOpSubgroupPartitionedInclusiveAnd:            out.debug << "subgroupPartitionedInclusiveAndNV";            break;
    case EOpSubgroupPartitionedInclusiveOr:             out.debug << "subgroupPartitionedInclusiveOrNV";             break;
    case EOpSubgroupPartitionedInclusiveXor:            out.debug << "subgroupPartitionedInclusiveXorNV";            break;
    case EOpSubgroupPartitionedExclusiveAdd:            out.debug << "subgroupPartitionedExclusiveAddNV";            break;
    case EOpSubgroupPartitionedExclusiveMul:            out.debug << "subgroupPartitionedExclusiveMulNV";            break;
    case EOpSubgroupPartitionedExclusiveMin:            out.debug << "subgroupPartitionedExclusiveMinNV";            break;
    case EOpSubgroupPartitionedExclusiveMax:            out.debug << "subgroupPartitionedExclusiveMaxNV";            break;
    case EOpSubgroupPartitionedExclusiveAnd:            out.debug << "subgroupPartitionedExclusiveAndNV";            break;
    case EOpSubgroupPartitionedExclusiveOr:             out.debug << "subgroupPartitionedExclusiveOrNV";             break;
    case EOpSubgroupPartitionedExclusiveXor:            out.debug << "subgroupPartitionedExclusiveXorNV";            break;

    case EOpClip:                   out.debug << "clip";                  break;
    case EOpIsFinite:               out.debug << "isfinite";              break;
    case EOpLog10:                  out.debug << "log10";                 break;
    case EOpRcp:                    out.debug << "rcp";                   break;
    case EOpSaturate:               out.debug << "saturate";              break;

    case EOpSparseTexelsResident:   out.debug << "sparseTexelsResident";  break;

    case EOpMinInvocations:             out.debug << "minInvocations";              break;
    case EOpMaxInvocations:             out.debug << "maxInvocations";              break;
    case EOpAddInvocations:             out.debug << "addInvocations";              break;
    case EOpMinInvocationsNonUniform:   out.debug << "minInvocationsNonUniform";    break;
    case EOpMaxInvocationsNonUniform:   out.debug << "maxInvocationsNonUniform";    break;
    case EOpAddInvocationsNonUniform:   out.debug << "addInvocationsNonUniform";    break;

    case EOpMinInvocationsInclusiveScan:            out.debug << "minInvocationsInclusiveScan";             break;
    case EOpMaxInvocationsInclusiveScan:            out.debug << "maxInvocationsInclusiveScan";             break;
    case EOpAddInvocationsInclusiveScan:            out.debug << "addInvocationsInclusiveScan";             break;
    case EOpMinInvocationsInclusiveScanNonUniform:  out.debug << "minInvocationsInclusiveScanNonUniform";   break;
    case EOpMaxInvocationsInclusiveScanNonUniform:  out.debug << "maxInvocationsInclusiveScanNonUniform";   break;
    case EOpAddInvocationsInclusiveScanNonUniform:  out.debug << "addInvocationsInclusiveScanNonUniform";   break;

    case EOpMinInvocationsExclusiveScan:            out.debug << "minInvocationsExclusiveScan";             break;
    case EOpMaxInvocationsExclusiveScan:            out.debug << "maxInvocationsExclusiveScan";             break;
    case EOpAddInvocationsExclusiveScan:            out.debug << "addInvocationsExclusiveScan";             break;
    case EOpMinInvocationsExclusiveScanNonUniform:  out.debug << "minInvocationsExclusiveScanNonUniform";   break;
    case EOpMaxInvocationsExclusiveScanNonUniform:  out.debug << "maxInvocationsExclusiveScanNonUniform";   break;
    case EOpAddInvocationsExclusiveScanNonUniform:  out.debug << "addInvocationsExclusiveScanNonUniform";   break;

    case EOpMbcnt:                  out.debug << "mbcnt";                       break;

    case EOpFragmentMaskFetch:      out.debug << "fragmentMaskFetchAMD";        break;
    case EOpFragmentFetch:          out.debug << "fragmentFetchAMD";            break;

    case EOpCubeFaceIndex:          out.debug << "cubeFaceIndex";               break;
    case EOpCubeFaceCoord:          out.debug << "cubeFaceCoord";               break;

    case EOpSubpassLoad:   out.debug << "subpassLoad";   break;
    case EOpSubpassLoadMS: out.debug << "subpassLoadMS"; break;

    case EOpColorAttachmentReadEXT:   out.debug << "colorAttachmentReadEXT";   break;

    case EOpConstructReference: out.debug << "Construct reference type"; break;

    case EOpDeclare: out.debug << "Declare"; break;

    case EOpSpirvInst: out.debug << "spirv_instruction"; break;

    case EOpCreateTensorLayoutNV:           out.debug << "createTensorLayoutNV"; break;
    case EOpTensorLayoutSetBlockSizeNV:     out.debug << "setTensorLayoutBlockSizeNV"; break;
    case EOpTensorLayoutSetDimensionNV:     out.debug << "setTensorLayoutDimensionNV"; break;
    case EOpTensorLayoutSetStrideNV:        out.debug << "setTensorLayoutStrideNV"; break;
    case EOpTensorLayoutSliceNV:            out.debug << "sliceTensorLayoutNV"; break;
    case EOpTensorLayoutSetClampValueNV:    out.debug << "setTensorLayoutClampValueNV"; break;
    case EOpCreateTensorViewNV:             out.debug << "createTensorViewNV"; break;
    case EOpTensorViewSetDimensionNV:       out.debug << "setTensorViewDimensionsNV"; break;
    case EOpTensorViewSetStrideNV:          out.debug << "setTensorViewStrideNV"; break;
    case EOpTensorViewSetClipNV:            out.debug << "setTensorViewClipNV"; break;

    default: out.debug.message(EPrefixError, "Bad unary op");
    }

    out.debug << " (" << node->getCompleteString() << ")";

    out.debug << "\n";

    return true;
}